

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::SwiftCompilerShellCommand::processDiscoveredDependencies(llbuild::core::
TaskInterface,llvm::StringRef)::DepsActions::error(llvm::StringRef_unsigned_long_
          (void *this,StringRef message,uint64_t position)

{
  _func_int *p_Var1;
  long lVar2;
  BuildEngineDelegate *pBVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  char *pcVar8;
  ulong uVar9;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  TaskInterface local_b8;
  long local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ulong *local_98;
  long local_90;
  ulong local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pcVar8 = message.Data;
  local_b8.impl = *(void **)((long)this + 8);
  local_b8.ctx = *(void **)((long)this + 0x10);
  pBVar3 = llbuild::core::TaskInterface::delegate(&local_b8);
  p_Var1 = pBVar3[1]._vptr_BuildEngineDelegate[1];
  local_78 = *(undefined8 *)((long)this + 0x28);
  lVar2 = *(long *)((long)this + 0x18);
  local_50 = &local_40;
  if (lVar2 == 0) {
    local_48 = 0;
    local_40 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,lVar2,*(long *)((long)this + 0x20) + lVar2);
  }
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1f5964);
  local_70 = &local_60;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_88 = *puVar7;
    uStack_80 = (undefined4)plVar4[3];
    uStack_7c = *(undefined4 *)((long)plVar4 + 0x1c);
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar7;
    local_98 = (ulong *)*plVar4;
  }
  local_90 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_d8 = &local_c8;
  if (pcVar8 == (char *)0x0) {
    local_d0 = 0;
    local_c8 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,pcVar8,pcVar8 + message.Length);
  }
  uVar9 = 0xf;
  if (local_98 != &local_88) {
    uVar9 = local_88;
  }
  if (uVar9 < (ulong)(local_d0 + local_90)) {
    uVar9 = 0xf;
    if (local_d8 != &local_c8) {
      uVar9 = CONCAT71(uStack_c7,local_c8);
    }
    if ((ulong)(local_d0 + local_90) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_98);
      goto LAB_0019d32e;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8);
LAB_0019d32e:
  local_b8.impl = &local_a8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_a8 = *plVar4;
    uStack_a0 = *(undefined4 *)(puVar5 + 3);
    uStack_9c = *(undefined4 *)((long)puVar5 + 0x1c);
  }
  else {
    local_a8 = *plVar4;
    local_b8.impl = (long *)*puVar5;
  }
  local_b8.ctx = (void *)puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  (**(code **)(*(long *)p_Var1 + 0x58))(p_Var1,local_78,local_b8.impl,local_b8.ctx);
  if ((long *)local_b8.impl != &local_a8) {
    operator_delete(local_b8.impl,local_a8 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  *(int *)((long)this + 0x30) = *(int *)((long)this + 0x30) + 1;
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
        getBuildSystem(ti).getDelegate().commandHadError(command,
                       "error reading dependency file '" + depsPath.str() +
                       "': " + message.str());
        ++numErrors;
      }